

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int ptls_buffer_push_asn1_ubigint(ptls_buffer_t *buf,void *bignum,size_t size)

{
  long *plVar1;
  size_t sVar2;
  undefined1 *puVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  undefined1 *extraout_RDX;
  ptls_buffer_t *ppVar7;
  size_t sVar8;
  
  plVar1 = (long *)((long)bignum + size);
  if (0 < (long)size) {
    for (; (char)*bignum == '\0'; bignum = (void *)((long)bignum + 1)) {
      size = size - 1;
      if ((long)size < 1) {
        size = 0;
        bignum = plVar1;
        break;
      }
    }
  }
  iVar4 = ptls_buffer_reserve_aligned(buf,1,'\0');
  if (iVar4 == 0) {
    buf->base[buf->off] = '\x02';
    buf->off = buf->off + 1;
    iVar4 = ptls_buffer_reserve_aligned(buf,1,'\0');
    if (iVar4 == 0) {
      buf->base[buf->off] = 0xff;
      sVar2 = buf->off;
      sVar8 = sVar2 + 1;
      buf->off = sVar8;
      if ((char)*bignum < '\0') {
        iVar4 = ptls_buffer_reserve_aligned(buf,1,'\0');
        if (iVar4 != 0) {
          return iVar4;
        }
        buf->base[buf->off] = '\0';
        buf->off = buf->off + 1;
      }
      ppVar7 = buf;
      if ((long *)bignum == plVar1) {
        bignum = (long *)0x1;
        iVar4 = ptls_buffer_reserve_aligned(buf,1,'\0');
        if (iVar4 != 0) {
          return iVar4;
        }
        buf->base[buf->off] = '\0';
        sVar5 = buf->off + 1;
        buf->off = sVar5;
      }
      else {
        iVar4 = ptls_buffer__do_pushv(buf,bignum,size);
        if (iVar4 != 0) {
          return iVar4;
        }
        sVar5 = buf->off;
      }
      uVar6 = sVar5 - sVar8;
      if (0x7f < uVar6) {
        ptls_buffer_push_asn1_ubigint_cold_1();
        puVar3 = *bignum;
        if (puVar3 == extraout_RDX) {
          return 0x32;
        }
        *(undefined1 **)bignum = puVar3 + 1;
        *(undefined1 *)&ppVar7->base = *puVar3;
        return 0;
      }
      buf->base[sVar2] = (uint8_t)uVar6;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int ptls_buffer_push_asn1_ubigint(ptls_buffer_t *buf, const void *bignum, size_t size)
{
    const uint8_t *p = bignum, *const end = p + size;
    int ret;

    /* skip zeroes */
    for (; end - p >= 1; ++p)
        if (*p != 0)
            break;

    /* emit */
    ptls_buffer_push(buf, 2);
    ptls_buffer_push_asn1_block(buf, {
        if (*p >= 0x80)
            ptls_buffer_push(buf, 0);
        if (p != end) {
            ptls_buffer_pushv(buf, p, end - p);
        } else {
            ptls_buffer_pushv(buf, "", 1);
        }
    });
    ret = 0;

Exit:
    return ret;
}